

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureShadowTests.cpp
# Opt level: O0

bool vkt::texture::anon_unknown_0::verifyTexCompareResult<tcu::TextureCube>
               (TestContext *testCtx,ConstPixelBufferAccess *result,TextureCube *src,float *texCoord
               ,ReferenceParams *sampleParams,TexComparePrecision *comparePrec,LodPrecision *lodPrec
               ,PixelFormat *pixelFormat)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  TestLog *this;
  TextureFormat *format;
  MessageBuilder *pMVar4;
  TestLog *pTVar5;
  allocator<char> local_891;
  string local_890;
  allocator<char> local_869;
  string local_868;
  LogImage local_848;
  allocator<char> local_7b1;
  string local_7b0;
  allocator<char> local_789;
  string local_788;
  LogImage local_768;
  allocator<char> local_6d1;
  string local_6d0;
  allocator<char> local_6a9;
  string local_6a8;
  LogImage local_688;
  allocator<char> local_5f1;
  string local_5f0;
  allocator<char> local_5c9;
  string local_5c8;
  LogImageSet local_5a8;
  MessageBuilder local_568;
  TextureCubeView local_3e8;
  PixelBufferAccess local_3b0;
  ConstPixelBufferAccess local_388;
  TextureCubeView local_360;
  SurfaceAccess local_328;
  TextureCubeView local_308;
  PixelBufferAccess local_2d0;
  ConstPixelBufferAccess local_2a8;
  TextureCubeView local_280;
  SurfaceAccess local_248;
  undefined1 local_228 [8];
  TextureCube clampedSource;
  int numFailedPixels;
  IVec4 local_a8;
  tcu local_98 [16];
  undefined1 local_88 [8];
  Vec3 nonShadowThreshold;
  undefined1 local_70 [8];
  Surface errorMask;
  Surface reference;
  TestLog *log;
  TexComparePrecision *comparePrec_local;
  ReferenceParams *sampleParams_local;
  float *texCoord_local;
  TextureCube *src_local;
  ConstPixelBufferAccess *result_local;
  TestContext *testCtx_local;
  
  this = tcu::TestContext::getLog(testCtx);
  iVar2 = tcu::ConstPixelBufferAccess::getWidth(result);
  iVar3 = tcu::ConstPixelBufferAccess::getHeight(result);
  tcu::Surface::Surface((Surface *)&errorMask.m_pixels.m_cap,iVar2,iVar3);
  iVar2 = tcu::ConstPixelBufferAccess::getWidth(result);
  iVar3 = tcu::ConstPixelBufferAccess::getHeight(result);
  tcu::Surface::Surface((Surface *)local_70,iVar2,iVar3);
  glu::TextureTestUtil::getBitsVec((TextureTestUtil *)&stack0xffffffffffffff48,pixelFormat);
  tcu::operator-((tcu *)&local_a8,(Vector<int,_4> *)&stack0xffffffffffffff48,1);
  tcu::computeFixedPointThreshold(local_98,&local_a8);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_88,(int)local_98,1,2);
  format = tcu::TextureCube::getFormat(src);
  bVar1 = isFloatingPointDepthFormat(format);
  if (bVar1) {
    tcu::TextureCube::TextureCube((TextureCube *)local_228,src);
    clampFloatingPointTexture((TextureCube *)local_228);
    tcu::SurfaceAccess::SurfaceAccess(&local_248,(Surface *)&errorMask.m_pixels.m_cap,pixelFormat);
    tcu::TextureCube::operator_cast_to_TextureCubeView(&local_280,(TextureCube *)local_228);
    glu::TextureTestUtil::sampleTexture(&local_248,&local_280,texCoord,sampleParams);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_2a8,(Surface *)&errorMask.m_pixels.m_cap);
    tcu::Surface::getAccess(&local_2d0,(Surface *)local_70);
    tcu::TextureCube::operator_cast_to_TextureCubeView(&local_308,(TextureCube *)local_228);
    clampedSource.m_view.m_levels[5]._4_4_ =
         glu::TextureTestUtil::computeTextureCompareDiff
                   (result,&local_2a8,&local_2d0,&local_308,texCoord,sampleParams,comparePrec,
                    lodPrec,(Vec3 *)local_88);
    tcu::TextureCube::~TextureCube((TextureCube *)local_228);
  }
  else {
    tcu::SurfaceAccess::SurfaceAccess(&local_328,(Surface *)&errorMask.m_pixels.m_cap,pixelFormat);
    tcu::TextureCube::operator_cast_to_TextureCubeView(&local_360,src);
    glu::TextureTestUtil::sampleTexture(&local_328,&local_360,texCoord,sampleParams);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_388,(Surface *)&errorMask.m_pixels.m_cap);
    tcu::Surface::getAccess(&local_3b0,(Surface *)local_70);
    tcu::TextureCube::operator_cast_to_TextureCubeView(&local_3e8,src);
    clampedSource.m_view.m_levels[5]._4_4_ =
         glu::TextureTestUtil::computeTextureCompareDiff
                   (result,&local_388,&local_3b0,&local_3e8,texCoord,sampleParams,comparePrec,
                    lodPrec,(Vec3 *)local_88);
  }
  if (0 < clampedSource.m_view.m_levels[5]._4_4_) {
    tcu::TestLog::operator<<(&local_568,this,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_568,(char (*) [40])"ERROR: Result verification failed, got ");
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,(int *)((long)clampedSource.m_view.m_levels + 0x2c));
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [17])" invalid pixels!");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_568);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c8,"VerifyResult",&local_5c9)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f0,"Verification result",&local_5f1);
  tcu::LogImageSet::LogImageSet(&local_5a8,&local_5c8,&local_5f0);
  pTVar5 = tcu::TestLog::operator<<(this,&local_5a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a8,"Rendered",&local_6a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d0,"Rendered image",&local_6d1);
  tcu::LogImage::LogImage(&local_688,&local_6a8,&local_6d0,result,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(pTVar5,&local_688);
  tcu::LogImage::~LogImage(&local_688);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::allocator<char>::~allocator(&local_6d1);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  tcu::LogImageSet::~LogImageSet(&local_5a8);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::allocator<char>::~allocator(&local_5f1);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::allocator<char>::~allocator(&local_5c9);
  if (0 < clampedSource.m_view.m_levels[5]._4_4_) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_788,"Reference",&local_789);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7b0,"Ideal reference image",&local_7b1);
    tcu::LogImage::LogImage
              (&local_768,&local_788,&local_7b0,(Surface *)&errorMask.m_pixels.m_cap,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar5 = tcu::TestLog::operator<<(this,&local_768);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_868,"ErrorMask",&local_869);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_890,"Error mask",&local_891)
    ;
    tcu::LogImage::LogImage
              (&local_848,&local_868,&local_890,(Surface *)local_70,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(pTVar5,&local_848);
    tcu::LogImage::~LogImage(&local_848);
    std::__cxx11::string::~string((string *)&local_890);
    std::allocator<char>::~allocator(&local_891);
    std::__cxx11::string::~string((string *)&local_868);
    std::allocator<char>::~allocator(&local_869);
    tcu::LogImage::~LogImage(&local_768);
    std::__cxx11::string::~string((string *)&local_7b0);
    std::allocator<char>::~allocator(&local_7b1);
    std::__cxx11::string::~string((string *)&local_788);
    std::allocator<char>::~allocator(&local_789);
  }
  tcu::TestLog::operator<<(this,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
  bVar1 = clampedSource.m_view.m_levels[5]._4_4_ == 0;
  tcu::Surface::~Surface((Surface *)local_70);
  tcu::Surface::~Surface((Surface *)&errorMask.m_pixels.m_cap);
  return bVar1;
}

Assistant:

bool verifyTexCompareResult (tcu::TestContext&						testCtx,
							 const tcu::ConstPixelBufferAccess&		result,
							 const TextureType&						src,
							 const float*							texCoord,
							 const ReferenceParams&					sampleParams,
							 const tcu::TexComparePrecision&		comparePrec,
							 const tcu::LodPrecision&				lodPrec,
							 const tcu::PixelFormat&				pixelFormat)
{
	tcu::TestLog&	log					= testCtx.getLog();
	tcu::Surface	reference			(result.getWidth(), result.getHeight());
	tcu::Surface	errorMask			(result.getWidth(), result.getHeight());
	const tcu::Vec3	nonShadowThreshold	= tcu::computeFixedPointThreshold(getBitsVec(pixelFormat)-1).swizzle(1,2,3);
	int				numFailedPixels;

	// sampleTexture() expects source image to be the same state as it would be in a GL implementation, that is
	// the floating point depth values should be in [0, 1] range as data is clamped during texture upload. Since
	// we don't have a separate "uploading" phase and just reuse the buffer we used for GL-upload, do the clamping
	// here if necessary.

	if (isFloatingPointDepthFormat(src.getFormat()))
	{
		TextureType clampedSource(src);

		clampFloatingPointTexture(clampedSource);

		// sample clamped values

		sampleTexture(tcu::SurfaceAccess(reference, pixelFormat), clampedSource, texCoord, sampleParams);
		numFailedPixels = computeTextureCompareDiff(result, reference.getAccess(), errorMask.getAccess(), clampedSource, texCoord, sampleParams, comparePrec, lodPrec, nonShadowThreshold);
	}
	else
	{
		// sample raw values (they are guaranteed to be in [0, 1] range as the format cannot represent any other values)

		sampleTexture(tcu::SurfaceAccess(reference, pixelFormat), src, texCoord, sampleParams);
		numFailedPixels = computeTextureCompareDiff(result, reference.getAccess(), errorMask.getAccess(), src, texCoord, sampleParams, comparePrec, lodPrec, nonShadowThreshold);
	}

	if (numFailedPixels > 0)
		log << TestLog::Message << "ERROR: Result verification failed, got " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

	log << TestLog::ImageSet("VerifyResult", "Verification result")
		<< TestLog::Image("Rendered", "Rendered image", result);

	if (numFailedPixels > 0)
	{
		log << TestLog::Image("Reference", "Ideal reference image", reference)
			<< TestLog::Image("ErrorMask", "Error mask", errorMask);
	}

	log << TestLog::EndImageSet;

	return numFailedPixels == 0;
}